

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.hpp
# Opt level: O3

result_type_conflict4 __thiscall
effolkronium::
basic_random_local<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>,effolkronium::seeder_default,std::uniform_int_distribution,std::uniform_real_distribution,std::bernoulli_distribution>
::get<std::gamma_distribution<double>,double>
          (basic_random_local<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>,effolkronium::seeder_default,std::uniform_int_distribution,std::uniform_real_distribution,std::bernoulli_distribution>
           *this,double *args)

{
  double dVar1;
  result_type_conflict4 rVar2;
  gamma_distribution<double> local_48;
  
  local_48._M_param._M_alpha = *args;
  local_48._M_param._M_beta = 1.0;
  local_48._M_param._M_malpha =
       (double)(~-(ulong)(local_48._M_param._M_alpha < 1.0) & (ulong)local_48._M_param._M_alpha |
               (ulong)(local_48._M_param._M_alpha + 1.0) &
               -(ulong)(local_48._M_param._M_alpha < 1.0));
  dVar1 = (local_48._M_param._M_malpha + -0.3333333333333333) * 9.0;
  if (dVar1 < 0.0) {
    dVar1 = sqrt(dVar1);
  }
  else {
    dVar1 = SQRT(dVar1);
  }
  local_48._M_param._M_a2 = 1.0 / dVar1;
  local_48._M_nd._M_param._M_mean = 0.0;
  local_48._M_nd._M_param._M_stddev = 1.0;
  local_48._M_nd._M_saved = 0.0;
  local_48._M_nd._M_saved_available = false;
  rVar2 = std::gamma_distribution<double>::operator()
                    (&local_48,
                     (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                      *)this,&local_48._M_param);
  return rVar2;
}

Assistant:

typename Dist::result_type get( Args&&... args ) {
            return Dist{ std::forward<Args>( args )... }( m_engine );
        }